

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_ray_query.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_2::ValidateRayQueryPointer
          (ValidationState_t *_,Instruction *inst,uint32_t ray_query_index)

{
  uint uVar1;
  Instruction *pIVar2;
  char *pcVar3;
  DiagnosticStream DStack_1f8;
  
  uVar1 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)ray_query_index);
  pIVar2 = ValidationState_t::FindDef(_,uVar1);
  uVar1 = (pIVar2->inst_).opcode - 0x37;
  if ((uVar1 < 0xb) && ((0x411U >> (uVar1 & 0x1f) & 1) != 0)) {
    uVar1 = Instruction::GetOperandAs<unsigned_int>(pIVar2,0);
    pIVar2 = ValidationState_t::FindDef(_,uVar1);
    if ((pIVar2 == (Instruction *)0x0) || ((pIVar2->inst_).opcode != 0x20)) {
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar3 = "Ray Query must be a pointer";
    }
    else {
      uVar1 = Instruction::GetOperandAs<unsigned_int>(pIVar2,2);
      pIVar2 = ValidationState_t::FindDef(_,uVar1);
      if ((pIVar2 != (Instruction *)0x0) && ((pIVar2->inst_).opcode == 0x1178)) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar3 = "Ray Query must be a pointer to OpTypeRayQueryKHR";
    }
  }
  else {
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar3 = "Ray Query must be a memory object declaration";
  }
  std::operator<<((ostream *)&DStack_1f8,pcVar3);
  DiagnosticStream::~DiagnosticStream(&DStack_1f8);
  return DStack_1f8.error_;
}

Assistant:

spv_result_t ValidateRayQueryPointer(ValidationState_t& _,
                                     const Instruction* inst,
                                     uint32_t ray_query_index) {
  const uint32_t ray_query_id = inst->GetOperandAs<uint32_t>(ray_query_index);
  auto variable = _.FindDef(ray_query_id);
  const auto var_opcode = variable->opcode();
  if (!variable || (var_opcode != spv::Op::OpVariable &&
                    var_opcode != spv::Op::OpFunctionParameter &&
                    var_opcode != spv::Op::OpAccessChain)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Ray Query must be a memory object declaration";
  }
  auto pointer = _.FindDef(variable->GetOperandAs<uint32_t>(0));
  if (!pointer || pointer->opcode() != spv::Op::OpTypePointer) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Ray Query must be a pointer";
  }
  auto type = _.FindDef(pointer->GetOperandAs<uint32_t>(2));
  if (!type || type->opcode() != spv::Op::OpTypeRayQueryKHR) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Ray Query must be a pointer to OpTypeRayQueryKHR";
  }
  return SPV_SUCCESS;
}